

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitTableFill(BinaryInstWriter *this,TableFill *curr)

{
  uint32_t value;
  BufferWithRandomAccess *pBVar1;
  U32LEB local_20;
  U32LEB local_1c;
  TableFill *local_18;
  TableFill *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (TableFill *)this;
  pBVar1 = BufferWithRandomAccess::operator<<(this->o,-4);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x11);
  BufferWithRandomAccess::operator<<(pBVar1,local_1c);
  pBVar1 = this->o;
  value = WasmBinaryWriter::getTableIndex(this->parent,(Name)(local_18->table).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_20,value);
  BufferWithRandomAccess::operator<<(pBVar1,local_20);
  return;
}

Assistant:

void BinaryInstWriter::visitTableFill(TableFill* curr) {
  o << int8_t(BinaryConsts::MiscPrefix) << U32LEB(BinaryConsts::TableFill);
  o << U32LEB(parent.getTableIndex(curr->table));
}